

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O2

int GetDataBlock(gif_source_ptr sinfo,U_CHAR *buf)

{
  j_compress_ptr pjVar1;
  jpeg_error_mgr *pjVar2;
  uint uVar3;
  size_t sVar4;
  
  uVar3 = ReadByte(sinfo);
  if (0 < (int)uVar3) {
    sVar4 = fread(buf,1,(ulong)uVar3,(FILE *)(sinfo->pub).input_file);
    if (sVar4 != uVar3) {
      pjVar1 = sinfo->cinfo;
      pjVar2 = pjVar1->err;
      pjVar2->msg_code = 0x2b;
      (*pjVar2->error_exit)((j_common_ptr)pjVar1);
    }
  }
  return uVar3;
}

Assistant:

LOCAL(int)
GetDataBlock(gif_source_ptr sinfo, U_CHAR *buf)
/* Read a GIF data block, which has a leading count byte */
/* A zero-length block marks the end of a data block sequence */
{
  int count;

  count = ReadByte(sinfo);
  if (count > 0) {
    if (!ReadOK(sinfo->pub.input_file, buf, count))
      ERREXIT(sinfo->cinfo, JERR_INPUT_EOF);
  }
  return count;
}